

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

TypeBase * GetStackType(LlvmCompilationContext *ctx,TypeBase *valueType)

{
  TypeBase *valueType_local;
  LlvmCompilationContext *ctx_local;
  
  if (valueType == ctx->ctx->typeBool) {
    ctx_local = (LlvmCompilationContext *)ctx->ctx->typeInt;
  }
  else if (valueType == ctx->ctx->typeChar) {
    ctx_local = (LlvmCompilationContext *)ctx->ctx->typeInt;
  }
  else if (valueType == ctx->ctx->typeShort) {
    ctx_local = (LlvmCompilationContext *)ctx->ctx->typeInt;
  }
  else {
    ctx_local = (LlvmCompilationContext *)valueType;
    if (valueType == ctx->ctx->typeFloat) {
      ctx_local = (LlvmCompilationContext *)ctx->ctx->typeDouble;
    }
  }
  return (TypeBase *)ctx_local;
}

Assistant:

TypeBase* GetStackType(LlvmCompilationContext &ctx, TypeBase *valueType)
{
	if(valueType == ctx.ctx.typeBool)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeChar)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeShort)
		return ctx.ctx.typeInt;

	if(valueType == ctx.ctx.typeFloat)
		return ctx.ctx.typeDouble;

	return valueType;
}